

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O2

int libssh2_userauth_publickey_sk
              (LIBSSH2_SESSION *session,char *username,size_t username_len,uchar *publickeydata,
              size_t publickeydata_len,char *privatekeydata,size_t privatekeydata_len,
              char *passphrase,
              _func_int_LIBSSH2_SESSION_ptr_LIBSSH2_SK_SIG_INFO_ptr_uchar_ptr_size_t_int_uint8_t_char_ptr_uchar_ptr_size_t_void_ptr_ptr
              *sign_callback,void **abstract)

{
  size_t pubkeydata_len;
  size_t username_len_00;
  int iVar1;
  uchar *puVar2;
  char *pcVar3;
  size_t __n;
  uchar **pubkeydata;
  size_t *pubkeydata_len_00;
  uchar *tmp_publickeydata;
  size_t tmp_method_len;
  uchar *tmp_method;
  char *local_98;
  size_t local_90;
  void *sign_abstract;
  size_t local_80;
  uchar *local_78;
  size_t tmp_publickeydata_len;
  int local_68 [2];
  char *pcStack_60;
  uchar *local_58;
  size_t sStack_50;
  _func_int_LIBSSH2_SESSION_ptr_LIBSSH2_SK_SIG_INFO_ptr_uchar_ptr_size_t_int_uint8_t_char_ptr_uchar_ptr_size_t_void_ptr_ptr
  *local_48;
  void **ppvStack_40;
  
  tmp_method = (uchar *)0x0;
  tmp_method_len = 0;
  tmp_publickeydata = (uchar *)0x0;
  tmp_publickeydata_len = 0;
  local_78 = (uchar *)0x0;
  local_80 = 0;
  sign_abstract = local_68;
  local_58 = (uchar *)0x0;
  sStack_50 = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  pcStack_60 = (char *)0x0;
  local_48 = sign_callback;
  ppvStack_40 = abstract;
  if (privatekeydata == (char *)0x0 || privatekeydata_len == 0) {
    pcVar3 = "Invalid data in public and private key.";
LAB_0012a411:
    iVar1 = _libssh2_error(session,-0x10,pcVar3);
    return iVar1;
  }
  pubkeydata = &tmp_publickeydata;
  pubkeydata_len_00 = &tmp_publickeydata_len;
  local_98 = username;
  local_90 = username_len;
  iVar1 = _libssh2_sk_pub_keyfilememory
                    (session,&tmp_method,&tmp_method_len,pubkeydata,pubkeydata_len_00,local_68,
                     (uchar *)(local_68 + 1),&pcStack_60,&local_58,&sStack_50,privatekeydata,
                     privatekeydata_len,passphrase);
  if (iVar1 != 0) {
    pcVar3 = "Unable to extract public key from private key.";
    goto LAB_0012a411;
  }
  if (publickeydata == (uchar *)0x0 || publickeydata_len == 0) {
    session->userauth_pblc_method = tmp_method;
    session->userauth_pblc_method_len = tmp_method_len;
  }
  else {
    if (tmp_method != (uchar *)0x0) {
      (*session->free)(tmp_method,&session->abstract);
    }
    iVar1 = strncmp((char *)publickeydata,"sk-ecdsa-sha2-nistp256-cert-v01@openssh.com",0x2b);
    if (iVar1 == 0) {
      session->userauth_pblc_method_len = 0x2b;
      puVar2 = (uchar *)(*session->alloc)(0x2b,&session->abstract);
      session->userauth_pblc_method = puVar2;
      __n = session->userauth_pblc_method_len;
      pcVar3 = "sk-ecdsa-sha2-nistp256-cert-v01@openssh.com";
LAB_0012a4f9:
      memcpy(puVar2,pcVar3,__n);
    }
    else {
      iVar1 = strncmp((char *)publickeydata,"sk-ssh-ed25519-cert-v01@openssh.com",0x23);
      if (iVar1 == 0) {
        session->userauth_pblc_method_len = 0x23;
        puVar2 = (uchar *)(*session->alloc)(0x23,&session->abstract);
        session->userauth_pblc_method = puVar2;
        __n = session->userauth_pblc_method_len;
        pcVar3 = "sk-ssh-ed25519-cert-v01@openssh.com";
        goto LAB_0012a4f9;
      }
    }
    pubkeydata = &local_78;
    pubkeydata_len_00 = &local_80;
    iVar1 = memory_read_publickey
                      (session,&session->userauth_pblc_method,&session->userauth_pblc_method_len,
                       pubkeydata,pubkeydata_len_00,(char *)publickeydata,publickeydata_len);
    if (iVar1 != 0) goto LAB_0012a582;
  }
  username_len_00 = local_90;
  pcVar3 = local_98;
  puVar2 = *pubkeydata;
  pubkeydata_len = *pubkeydata_len_00;
  do {
    iVar1 = _libssh2_userauth_publickey
                      (session,pcVar3,username_len_00,puVar2,pubkeydata_len,libssh2_sign_sk,
                       &sign_abstract);
  } while (iVar1 == -0x25);
LAB_0012a582:
  if (tmp_publickeydata != (uchar *)0x0) {
    (*session->free)(tmp_publickeydata,&session->abstract);
  }
  if (pcStack_60 == (char *)0x0) {
    return iVar1;
  }
  (*session->free)(pcStack_60,&session->abstract);
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_userauth_publickey_sk(LIBSSH2_SESSION *session,
                              const char *username,
                              size_t username_len,
                              const unsigned char *publickeydata,
                              size_t publickeydata_len,
                              const char *privatekeydata,
                              size_t privatekeydata_len,
                              const char *passphrase,
                              LIBSSH2_USERAUTH_SK_SIGN_FUNC
                                  ((*sign_callback)),
                              void **abstract)
{
    int rc = LIBSSH2_ERROR_NONE;

    unsigned char *tmp_method = NULL;
    size_t tmp_method_len = 0;

    unsigned char *tmp_publickeydata = NULL;
    size_t tmp_publickeydata_len = 0;

    unsigned char *pubkeydata = NULL;
    size_t pubkeydata_len = 0;

    LIBSSH2_PRIVKEY_SK sk_info = { 0 };
    void *sign_abstract = &sk_info;

    sk_info.sign_callback = sign_callback;
    sk_info.orig_abstract = abstract;

    if(privatekeydata_len && privatekeydata) {

        if(_libssh2_sk_pub_keyfilememory(session,
                                         &tmp_method,
                                         &tmp_method_len,
                                         &tmp_publickeydata,
                                         &tmp_publickeydata_len,
                                         &(sk_info.algorithm),
                                         &(sk_info.flags),
                                         &(sk_info.application),
                                         &(sk_info.key_handle),
                                         &(sk_info.handle_len),
                                         privatekeydata, privatekeydata_len,
                                         passphrase)) {
            return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                                  "Unable to extract public key "
                                  "from private key.");
        }
        else if(publickeydata_len == 0 || !publickeydata) {
            session->userauth_pblc_method = tmp_method;
            session->userauth_pblc_method_len = tmp_method_len;

            pubkeydata_len = tmp_publickeydata_len;
            pubkeydata = tmp_publickeydata;
        }
        else {
            const char *ecdsa = "sk-ecdsa-sha2-nistp256-cert-v01@openssh.com";
            const char *ed25519 = "sk-ssh-ed25519-cert-v01@openssh.com";

            if(tmp_method) {
                LIBSSH2_FREE(session, tmp_method);
            }

            if(!strncmp((char *)publickeydata, ecdsa, strlen(ecdsa))) {
                session->userauth_pblc_method_len = strlen(ecdsa);
                session->userauth_pblc_method =
                    LIBSSH2_ALLOC(session, session->userauth_pblc_method_len);

                memcpy(session->userauth_pblc_method, ecdsa,
                       session->userauth_pblc_method_len);
            }
            else if(!strncmp((char *)publickeydata, ed25519,
                             strlen(ed25519))) {
                session->userauth_pblc_method_len = strlen(ed25519);
                session->userauth_pblc_method =
                    LIBSSH2_ALLOC(session, session->userauth_pblc_method_len);

                memcpy(session->userauth_pblc_method, ed25519,
                       session->userauth_pblc_method_len);
            }

            rc = memory_read_publickey(session,
                                       &session->userauth_pblc_method,
                                       &session->userauth_pblc_method_len,
                                       &pubkeydata, &pubkeydata_len,
                                       (char *)publickeydata,
                                       publickeydata_len);
        }
    }
    else {
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Invalid data in public and private key.");
    }

    if(rc == LIBSSH2_ERROR_NONE) {
        rc = _libssh2_userauth_publickey(session, username, username_len,
                                         pubkeydata, pubkeydata_len,
                                         libssh2_sign_sk, &sign_abstract);

        while(rc == LIBSSH2_ERROR_EAGAIN) {
            rc = _libssh2_userauth_publickey(session, username, username_len,
                                             pubkeydata, pubkeydata_len,
                                             libssh2_sign_sk, &sign_abstract);
        }
    }

    if(tmp_publickeydata)
        LIBSSH2_FREE(session, tmp_publickeydata);

    if(sk_info.application) {
        LIBSSH2_FREE(session, (void *)sk_info.application);
    }

    return rc;
}